

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

idx_t duckdb::GetRowGroupOffset(ParquetReader *reader,idx_t group_idx)

{
  FileMetaData *pFVar1;
  const_reference pvVar2;
  idx_t i;
  size_type __n;
  idx_t iVar3;
  
  pFVar1 = ParquetReader::GetFileMetadata(reader);
  iVar3 = 0;
  for (__n = 0; group_idx != __n; __n = __n + 1) {
    pvVar2 = vector<duckdb_parquet::RowGroup,_true>::get<true>(&pFVar1->row_groups,__n);
    iVar3 = iVar3 + pvVar2->num_rows;
  }
  return iVar3;
}

Assistant:

idx_t GetRowGroupOffset(ParquetReader &reader, idx_t group_idx) {
	idx_t row_group_offset = 0;
	auto &row_groups = reader.GetFileMetadata()->row_groups;
	for (idx_t i = 0; i < group_idx; i++) {
		row_group_offset += row_groups[i].num_rows;
	}
	return row_group_offset;
}